

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_rsa_initPEMFromMemory
              (LIBSSH2_SESSION *session,char *privkeyfiledata,size_t privkeyfiledata_len,
              uchar *passphrase,void **abstract)

{
  int iVar1;
  RSA *pRStack_40;
  int ret;
  RSA *rsactx;
  void **abstract_local;
  uchar *passphrase_local;
  size_t privkeyfiledata_len_local;
  char *privkeyfiledata_local;
  LIBSSH2_SESSION *session_local;
  
  rsactx = (RSA *)abstract;
  abstract_local = (void **)passphrase;
  passphrase_local = (uchar *)privkeyfiledata_len;
  privkeyfiledata_len_local = (size_t)privkeyfiledata;
  privkeyfiledata_local = (char *)session;
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_rsa_dtor(session,abstract);
    *(undefined8 *)rsactx = 0;
  }
  iVar1 = _libssh2_rsa_new_private_frommemory
                    (&stack0xffffffffffffffc0,(LIBSSH2_SESSION *)privkeyfiledata_local,
                     (char *)privkeyfiledata_len_local,(size_t)passphrase_local,
                     (uchar *)abstract_local);
  if (iVar1 == 0) {
    *(RSA **)rsactx = pRStack_40;
    session_local._4_4_ = 0;
  }
  else {
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_rsa_initPEMFromMemory(LIBSSH2_SESSION * session,
                                         const char *privkeyfiledata,
                                         size_t privkeyfiledata_len,
                                         unsigned const char *passphrase,
                                         void **abstract)
{
    libssh2_rsa_ctx *rsactx;
    int ret;

    if(*abstract) {
        hostkey_method_ssh_rsa_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_rsa_new_private_frommemory(&rsactx, session,
                                              privkeyfiledata,
                                              privkeyfiledata_len, passphrase);
    if(ret) {
        return -1;
    }

    *abstract = rsactx;

    return 0;
}